

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.h
# Opt level: O3

void __thiscall sentencepiece::TrainerSpec::set_unk_surface(TrainerSpec *this,string *value)

{
  void *pvVar1;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set(&this->unk_surface_,value,pvVar1);
  return;
}

Assistant:

inline void TrainerSpec::set_unk_surface(std::string&& value) {
  _has_bits_[0] |= 0x00000008u;
  unk_surface_.Set(
    ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::NonEmptyDefault{}, ::std::move(value), GetArena());
  // @@protoc_insertion_point(field_set_rvalue:sentencepiece.TrainerSpec.unk_surface)
}